

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O3

void triphone_add(mdef_t *m,int ci,int lc,int rc,word_posn_t wpos,int p)

{
  phone_t *ppVar1;
  ph_lc_t ***ppppVar2;
  ph_rc_t *rcptr;
  ph_lc_t *ppVar3;
  ph_rc_t *ppVar4;
  ph_lc_t *lcptr;
  char buf [4096];
  char local_1038 [4104];
  
  if (m->n_phone <= p) {
    __assert_fail("p < m->n_phone",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                  ,0x8b,"void triphone_add(mdef_t *, int, int, int, word_posn_t, int)");
  }
  ppVar1 = m->phone;
  ppVar1[p].ci = (int16)ci;
  ppVar1[p].lc = (int16)lc;
  ppVar1[p].rc = (int16)rc;
  ppVar1[p].wpos = wpos;
  if (m->n_ciphone <= p) {
    for (ppVar3 = m->wpos_ci_lclist[wpos][ci]; ppVar3 != (ph_lc_t *)0x0; ppVar3 = ppVar3->next) {
      if (ppVar3->lc == lc) goto LAB_00106c1c;
    }
    ppVar3 = (ph_lc_t *)
             __ckd_calloc__(1,0x18,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                            ,0x97);
    ppVar3->lc = (int16)lc;
    ppppVar2 = m->wpos_ci_lclist;
    ppVar3->next = ppppVar2[wpos][ci];
    ppppVar2[wpos][ci] = ppVar3;
LAB_00106c1c:
    for (ppVar4 = ppVar3->rclist; ppVar4 != (ph_rc_t *)0x0; ppVar4 = ppVar4->next) {
      if (ppVar4->rc == rc) {
        mdef_phone_str(m,ppVar4->pid,local_1038);
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                ,0xa0,"Duplicate triphone: %s\n",local_1038);
        exit(1);
      }
    }
    ppVar4 = (ph_rc_t *)
             __ckd_calloc__(1,0x10,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                            ,0xa3);
    ppVar4->rc = (int16)rc;
    ppVar4->pid = p;
    ppVar4->next = ppVar3->rclist;
    ppVar3->rclist = ppVar4;
  }
  return;
}

Assistant:

static void
triphone_add(mdef_t * m,
             int ci, int lc, int rc, word_posn_t wpos,
             int p)
{
    ph_lc_t *lcptr;
    ph_rc_t *rcptr;

    assert(p < m->n_phone);

    /* Fill in phone[p] information (state and tmat mappings added later) */
    m->phone[p].ci = ci;
    m->phone[p].lc = lc;
    m->phone[p].rc = rc;
    m->phone[p].wpos = wpos;

    /* Create <ci,lc,rc,wpos> -> p mapping if not a CI phone */
    if (p >= m->n_ciphone) {
        if ((lcptr = find_ph_lc(m->wpos_ci_lclist[wpos][(int) ci], lc))
            == NULL) {
            lcptr = (ph_lc_t *) ckd_calloc(1, sizeof(ph_lc_t)); /* freed at mdef_free, I believe */
            lcptr->lc = lc;
            lcptr->next = m->wpos_ci_lclist[wpos][(int) ci];
            m->wpos_ci_lclist[wpos][(int) ci] = lcptr;  /* This is what needs to be freed */
        }
        if ((rcptr = find_ph_rc(lcptr->rclist, rc)) != NULL) {
            __BIGSTACKVARIABLE__ char buf[4096];

            mdef_phone_str(m, rcptr->pid, buf);
            E_FATAL("Duplicate triphone: %s\n", buf);
        }

        rcptr = (ph_rc_t *) ckd_calloc(1, sizeof(ph_rc_t));     /* freed in mdef_free, I believe */
        rcptr->rc = rc;
        rcptr->pid = p;
        rcptr->next = lcptr->rclist;
        lcptr->rclist = rcptr;
    }
}